

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalextract.h
# Opt level: O0

double __thiscall
hbm::streaming::extract<double,_(hbm::streaming::endian)0>::operator()
          (extract<double,_(hbm::streaming::endian)0> *this,uchar **p)

{
  double dVar1;
  long *in_RSI;
  double value;
  swap_impl<8UL,_(hbm::streaming::endian)0> swapper;
  copy_type temp;
  
  dVar1 = (double)swap_impl<8UL,_(hbm::streaming::endian)0>::swap(0x14a9f8);
  *in_RSI = *in_RSI + 8;
  return dVar1;
}

Assistant:

inline RET operator()(unsigned char **p) const
			{
				typename copy_traits<RET>::copy_type temp;
				std::memcpy(&temp, *p, sizeof(temp));
				swap_impl<sizeof(temp), e> swapper;
				temp = swapper.swap(temp);
				RET value;
				std::memcpy(&value, &temp, sizeof(value));
				*p = (*p) + sizeof(RET);
				return value;
			}